

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *pTVar2;
  string *psVar3;
  undefined1 *puVar4;
  long lVar5;
  long lVar6;
  string example_struct;
  string shader_source;
  long *local_78 [2];
  long local_68 [2];
  SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::ES> *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_78[0] = local_68;
  local_58 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"struct light {\n    float intensity;\n    int   position;\n};\n\n",
             "");
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  lVar6 = 1;
  do {
    std::__cxx11::string::_M_assign((string *)&local_50);
    std::__cxx11::string::_M_append((char *)&local_50,shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)&local_50);
    lVar5 = lVar6;
    do {
      std::__cxx11::string::append((char *)&local_50);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    std::__cxx11::string::append((char *)&local_50);
    puVar1 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_50);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar1 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_50,*puVar1);
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x54f);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&local_50,shader_end_abi_cxx11_);
    puVar4 = empty_string_abi_cxx11_;
    psVar3 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar4 = default_vertex_shader_source_abi_cxx11_;
      psVar3 = (string *)&local_50;
      break;
    case VERTEX_SHADER_TYPE:
      puVar4 = (string *)&local_50;
      goto LAB_00b3394f;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
    case TESSELATION_CONTROL_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar4 = default_vertex_shader_source_abi_cxx11_;
LAB_00b3394f:
      psVar3 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x552);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(local_58->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
      super_TestNode._vptr_TestNode[9])(local_58,puVar4,psVar3,1,0);
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) {
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsStructTypes1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float intensity;\n"
							   "    int   position;\n"
							   "};\n\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += "    light[2]";

		for (size_t temp_dimension_index = 0; temp_dimension_index < max_dimension_index; temp_dimension_index++)
		{
			shader_source += "[2]";
		}

		shader_source += " x;\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

	} /* for (int max_dimension_index = 1; ...) */
}